

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_res.cpp
# Opt level: O0

CollationCacheEntry * __thiscall
icu_63::CollationLoader::loadFromData(CollationLoader *this,UErrorCode *errorCode)

{
  UBool UVar1;
  int iVar2;
  CollationTailoring *pCVar3;
  UResourceBundle *pUVar4;
  uint8_t *__buf;
  char *pcVar5;
  char *pcVar6;
  UChar *us;
  CollationLoader *this_00;
  CollationLoader *local_200;
  CollationTailoring *local_e0;
  CollationCacheEntry *entry;
  UChar *s_1;
  int32_t len_1;
  LocalUResourceBundlePointer def;
  UErrorCode internalErrorCode_1;
  LocalUResourceBundlePointer actualBundle;
  UBool actualAndValidLocalesAreDifferent;
  char *vLocale;
  char *actualLocale;
  UChar *local_70;
  UChar *s;
  int32_t len;
  UErrorCode internalErrorCode;
  uint8_t *inBytes;
  int32_t length;
  LocalUResourceBundlePointer binary;
  LocalPointerBase<icu_63::CollationTailoring> local_28;
  LocalPointer<icu_63::CollationTailoring> t;
  UErrorCode *errorCode_local;
  CollationLoader *this_local;
  
  t.super_LocalPointerBase<icu_63::CollationTailoring>.ptr =
       (LocalPointerBase<icu_63::CollationTailoring>)
       (LocalPointerBase<icu_63::CollationTailoring>)errorCode;
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 != '\0') {
    return (CollationCacheEntry *)0x0;
  }
  pCVar3 = (CollationTailoring *)UMemory::operator_new((UMemory *)0x190,(size_t)errorCode);
  local_e0 = (CollationTailoring *)0x0;
  if (pCVar3 != (CollationTailoring *)0x0) {
    CollationTailoring::CollationTailoring(pCVar3,this->rootEntry->tailoring->settings);
    local_e0 = pCVar3;
  }
  LocalPointer<icu_63::CollationTailoring>::LocalPointer
            ((LocalPointer<icu_63::CollationTailoring> *)&local_28,local_e0);
  UVar1 = LocalPointerBase<icu_63::CollationTailoring>::isNull(&local_28);
  if (UVar1 == '\0') {
    pCVar3 = LocalPointerBase<icu_63::CollationTailoring>::operator->(&local_28);
    UVar1 = CollationTailoring::isBogus(pCVar3);
    if (UVar1 == '\0') {
      pUVar4 = ures_getByKey_63(this->data,"%%CollationBin",(UResourceBundle *)0x0,
                                (UErrorCode *)
                                t.super_LocalPointerBase<icu_63::CollationTailoring>.ptr);
      LocalUResourceBundlePointer::LocalUResourceBundlePointer
                ((LocalUResourceBundlePointer *)&stack0xffffffffffffffb0,pUVar4);
      pUVar4 = LocalPointerBase<UResourceBundle>::getAlias
                         ((LocalPointerBase<UResourceBundle> *)&stack0xffffffffffffffb0);
      __buf = ures_getBinary_63(pUVar4,(int32_t *)((long)&inBytes + 4),
                                (UErrorCode *)
                                t.super_LocalPointerBase<icu_63::CollationTailoring>.ptr);
      pCVar3 = this->rootEntry->tailoring;
      _len = __buf;
      LocalPointerBase<icu_63::CollationTailoring>::operator*(&local_28);
      CollationDataReader::read((int)pCVar3,__buf,(ulong)inBytes._4_4_);
      UVar1 = ::U_FAILURE(*(UErrorCode *)t.super_LocalPointerBase<icu_63::CollationTailoring>.ptr);
      if (UVar1 == '\0') {
        s._4_4_ = U_ZERO_ERROR;
        local_70 = ures_getStringByKey_63
                             (this->data,"Sequence",(int32_t *)&s,(UErrorCode *)((long)&s + 4));
        UVar1 = ::U_SUCCESS(s._4_4_);
        if (UVar1 != '\0') {
          pCVar3 = LocalPointerBase<icu_63::CollationTailoring>::operator->(&local_28);
          ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&actualLocale,local_70);
          UnicodeString::setTo(&pCVar3->rules,'\x01',(ConstChar16Ptr *)&actualLocale,(int32_t)s);
          ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&actualLocale);
        }
        pcVar5 = Locale::getBaseName(&this->locale);
        pcVar6 = Locale::getBaseName(&this->validLocale);
        iVar2 = strcmp(pcVar5,pcVar6);
        actualBundle.super_LocalPointerBase<UResourceBundle>.ptr._7_1_ = iVar2 != 0;
        if ((bool)actualBundle.super_LocalPointerBase<UResourceBundle>.ptr._7_1_) {
          pUVar4 = ures_open_63("icudt63l-coll",pcVar5,
                                (UErrorCode *)
                                t.super_LocalPointerBase<icu_63::CollationTailoring>.ptr);
          LocalUResourceBundlePointer::LocalUResourceBundlePointer
                    ((LocalUResourceBundlePointer *)&stack0xffffffffffffff68,pUVar4);
          UVar1 = ::U_FAILURE(*(UErrorCode *)
                               t.super_LocalPointerBase<icu_63::CollationTailoring>.ptr);
          if (UVar1 == '\0') {
            def.super_LocalPointerBase<UResourceBundle>.ptr._4_4_ = U_ZERO_ERROR;
            pUVar4 = LocalPointerBase<UResourceBundle>::getAlias
                               ((LocalPointerBase<UResourceBundle> *)&stack0xffffffffffffff68);
            pUVar4 = ures_getByKeyWithFallback_63
                               (pUVar4,"collations/default",(UResourceBundle *)0x0,
                                (UErrorCode *)
                                ((long)&def.super_LocalPointerBase<UResourceBundle>.ptr + 4));
            LocalUResourceBundlePointer::LocalUResourceBundlePointer
                      ((LocalUResourceBundlePointer *)&stack0xffffffffffffff58,pUVar4);
            pUVar4 = LocalPointerBase<UResourceBundle>::getAlias
                               ((LocalPointerBase<UResourceBundle> *)&stack0xffffffffffffff58);
            us = ures_getString_63(pUVar4,(int32_t *)((long)&s_1 + 4),
                                   (UErrorCode *)
                                   ((long)&def.super_LocalPointerBase<UResourceBundle>.ptr + 4));
            UVar1 = ::U_SUCCESS(def.super_LocalPointerBase<UResourceBundle>.ptr._4_4_);
            if ((UVar1 == '\0') || (0xf < s_1._4_4_)) {
              strcpy(this->defaultType,"standard");
            }
            else {
              u_UCharsToChars_63(us,this->defaultType,s_1._4_4_ + 1);
            }
            LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                      ((LocalUResourceBundlePointer *)&stack0xffffffffffffff58);
            binary.super_LocalPointerBase<UResourceBundle>.ptr._0_4_ = 0;
          }
          else {
            this_local = (CollationLoader *)0x0;
            binary.super_LocalPointerBase<UResourceBundle>.ptr._0_4_ = 1;
          }
          LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                    ((LocalUResourceBundlePointer *)&stack0xffffffffffffff68);
          if ((int)binary.super_LocalPointerBase<UResourceBundle>.ptr != 0) goto LAB_00273398;
        }
        pCVar3 = LocalPointerBase<icu_63::CollationTailoring>::operator->(&local_28);
        Locale::operator=(&pCVar3->actualLocale,&this->locale);
        iVar2 = strcmp(this->type,this->defaultType);
        if (iVar2 == 0) {
          pcVar5 = Locale::getName(&this->locale);
          pcVar6 = Locale::getBaseName(&this->locale);
          iVar2 = strcmp(pcVar5,pcVar6);
          if (iVar2 != 0) {
            pCVar3 = LocalPointerBase<icu_63::CollationTailoring>::operator->(&local_28);
            pcVar6 = "collation";
            Locale::setKeywordValue
                      (&pCVar3->actualLocale,"collation",(char *)0x0,
                       (UErrorCode *)t.super_LocalPointerBase<icu_63::CollationTailoring>.ptr);
          }
        }
        else {
          pCVar3 = LocalPointerBase<icu_63::CollationTailoring>::operator->(&local_28);
          pcVar6 = "collation";
          Locale::setKeywordValue
                    (&pCVar3->actualLocale,"collation",this->type,
                     (UErrorCode *)t.super_LocalPointerBase<icu_63::CollationTailoring>.ptr);
        }
        UVar1 = ::U_FAILURE(*(UErrorCode *)t.super_LocalPointerBase<icu_63::CollationTailoring>.ptr)
        ;
        if (UVar1 == '\0') {
          if (this->typeFallback != '\0') {
            *(undefined4 *)t.super_LocalPointerBase<icu_63::CollationTailoring>.ptr = 0xffffff81;
          }
          pUVar4 = this->bundle;
          pCVar3 = LocalPointerBase<icu_63::CollationTailoring>::operator->(&local_28);
          pCVar3->bundle = pUVar4;
          this->bundle = (UResourceBundle *)0x0;
          this_00 = (CollationLoader *)UMemory::operator_new((UMemory *)0x100,(size_t)pcVar6);
          local_200 = (CollationLoader *)0x0;
          if (this_00 != (CollationLoader *)0x0) {
            pCVar3 = LocalPointerBase<icu_63::CollationTailoring>::getAlias(&local_28);
            CollationCacheEntry::CollationCacheEntry
                      ((CollationCacheEntry *)this_00,&this->validLocale,pCVar3);
            local_200 = this_00;
          }
          if (local_200 == (CollationLoader *)0x0) {
            *(undefined4 *)t.super_LocalPointerBase<icu_63::CollationTailoring>.ptr = 7;
            this_local = (CollationLoader *)0x0;
            binary.super_LocalPointerBase<UResourceBundle>.ptr._0_4_ = 1;
          }
          else {
            LocalPointerBase<icu_63::CollationTailoring>::orphan(&local_28);
            SharedObject::addRef((SharedObject *)local_200);
            this_local = local_200;
            binary.super_LocalPointerBase<UResourceBundle>.ptr._0_4_ = 1;
          }
        }
        else {
          this_local = (CollationLoader *)0x0;
          binary.super_LocalPointerBase<UResourceBundle>.ptr._0_4_ = 1;
        }
      }
      else {
        this_local = (CollationLoader *)0x0;
        binary.super_LocalPointerBase<UResourceBundle>.ptr._0_4_ = 1;
      }
LAB_00273398:
      LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                ((LocalUResourceBundlePointer *)&stack0xffffffffffffffb0);
      goto LAB_002733ae;
    }
  }
  *(undefined4 *)t.super_LocalPointerBase<icu_63::CollationTailoring>.ptr = 7;
  this_local = (CollationLoader *)0x0;
  binary.super_LocalPointerBase<UResourceBundle>.ptr._0_4_ = 1;
LAB_002733ae:
  LocalPointer<icu_63::CollationTailoring>::~LocalPointer
            ((LocalPointer<icu_63::CollationTailoring> *)&local_28);
  return (CollationCacheEntry *)this_local;
}

Assistant:

const CollationCacheEntry *
CollationLoader::loadFromData(UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return NULL; }
    LocalPointer<CollationTailoring> t(new CollationTailoring(rootEntry->tailoring->settings));
    if(t.isNull() || t->isBogus()) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
        return NULL;
    }

    // deserialize
    LocalUResourceBundlePointer binary(ures_getByKey(data, "%%CollationBin", NULL, &errorCode));
    // Note: U_MISSING_RESOURCE_ERROR --> The old code built from rules if available
    // but that created undesirable dependencies.
    int32_t length;
    const uint8_t *inBytes = ures_getBinary(binary.getAlias(), &length, &errorCode);
    CollationDataReader::read(rootEntry->tailoring, inBytes, length, *t, errorCode);
    // Note: U_COLLATOR_VERSION_MISMATCH --> The old code built from rules if available
    // but that created undesirable dependencies.
    if(U_FAILURE(errorCode)) { return NULL; }

    // Try to fetch the optional rules string.
    {
        UErrorCode internalErrorCode = U_ZERO_ERROR;
        int32_t len;
        const UChar *s = ures_getStringByKey(data, "Sequence", &len,
                                             &internalErrorCode);
        if(U_SUCCESS(internalErrorCode)) {
            t->rules.setTo(TRUE, s, len);
        }
    }

    const char *actualLocale = locale.getBaseName();  // without type
    const char *vLocale = validLocale.getBaseName();
    UBool actualAndValidLocalesAreDifferent = uprv_strcmp(actualLocale, vLocale) != 0;

    // For the actual locale, suppress the default type *according to the actual locale*.
    // For example, zh has default=pinyin and contains all of the Chinese tailorings.
    // zh_Hant has default=stroke but has no other data.
    // For the valid locale "zh_Hant" we need to suppress stroke.
    // For the actual locale "zh" we need to suppress pinyin instead.
    if(actualAndValidLocalesAreDifferent) {
        // Opening a bundle for the actual locale should always succeed.
        LocalUResourceBundlePointer actualBundle(
                ures_open(U_ICUDATA_COLL, actualLocale, &errorCode));
        if(U_FAILURE(errorCode)) { return NULL; }
        UErrorCode internalErrorCode = U_ZERO_ERROR;
        LocalUResourceBundlePointer def(
                ures_getByKeyWithFallback(actualBundle.getAlias(), "collations/default", NULL,
                                          &internalErrorCode));
        int32_t len;
        const UChar *s = ures_getString(def.getAlias(), &len, &internalErrorCode);
        if(U_SUCCESS(internalErrorCode) && len < UPRV_LENGTHOF(defaultType)) {
            u_UCharsToChars(s, defaultType, len + 1);
        } else {
            uprv_strcpy(defaultType, "standard");
        }
    }
    t->actualLocale = locale;
    if(uprv_strcmp(type, defaultType) != 0) {
        t->actualLocale.setKeywordValue("collation", type, errorCode);
    } else if(uprv_strcmp(locale.getName(), locale.getBaseName()) != 0) {
        // Remove the collation keyword if it was set.
        t->actualLocale.setKeywordValue("collation", NULL, errorCode);
    }
    if(U_FAILURE(errorCode)) { return NULL; }

    if(typeFallback) {
        errorCode = U_USING_DEFAULT_WARNING;
    }
    t->bundle = bundle;
    bundle = NULL;
    const CollationCacheEntry *entry = new CollationCacheEntry(validLocale, t.getAlias());
    if(entry == NULL) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
        return nullptr;
    } else {
        t.orphan();
    }
    // Have to add that reference that we promise.
    entry->addRef();
    return entry;
}